

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkHandleFailure(ARKodeMem ark_mem,int flag)

{
  int in_ESI;
  ARKodeMem in_RDI;
  int local_4;
  
  local_4 = in_ESI;
  switch(in_ESI) {
  case -0x2e:
    arkProcessError(in_RDI,-0x2e,0xa77,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"The relaxation Jacobian failed unrecoverably");
    break;
  case -0x2d:
    arkProcessError(in_RDI,-0x2d,0xa73,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"The relaxation function failed unrecoverably");
    break;
  case -0x2c:
    arkProcessError(in_RDI,-0x2c,0xa6f,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"The ARKODE relaxation module memory is NULL");
    break;
  case -0x2b:
    arkProcessError(in_RDI,-0x2b,0xa6a,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %Lg the relaxation module failed",(longdouble)in_RDI->tcur);
    break;
  default:
    arkProcessError(in_RDI,-99,0xa7c,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,
                    "ARKODE encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
                   );
    local_4 = -99;
    break;
  case -0x29:
    arkProcessError(in_RDI,-0x29,0xa66,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"ARKODE was provided an invalid method table");
    break;
  case -0x28:
    arkProcessError(in_RDI,-0x28,0xa61,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %Lg the interpolation module failed unrecoverably",
                    (longdouble)in_RDI->tcur);
    break;
  case -0x27:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x27,(char *)0xa55,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg the user-supplied predictor failed in an unrecoverable manner.");
    break;
  case -0x26:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x26,(char *)0xa5d,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %lg, the stage postprocessing routine failed in an unrecoverable manner."
                   );
    break;
  case -0x25:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x25,(char *)0xa59,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %lg, the step postprocessing routine failed in an unrecoverable manner."
                   );
    break;
  case -0x22:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x22,(char *)0xa4d,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, the inner stepper failed in an unrecoverable manner.");
    break;
  case -0x20:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x20,(char *)0xa51,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg the nonlinear solver failed in an unrecoverable manner.");
    break;
  case -0x1e:
    arkProcessError(in_RDI,-0x1e,0xa44,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %Lg the nonlinear solver setup failed unrecoverably",
                    (longdouble)in_RDI->tcur);
    break;
  case -0x1c:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x1c,(char *)0xa49,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, a vector operation failed.");
    break;
  case -0x1b:
    arkProcessError(in_RDI,-0x1b,0xa38,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"tout too close to t0 to start integration.");
    break;
  case -0x13:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x13,(char *)0xa3c,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, unable to satisfy inequality constraints.");
    break;
  case -0x10:
    arkProcessError(in_RDI,-0x10,0xa40,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"The mass matrix solver failed.");
    break;
  case -0xc:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0xc,(char *)0xa34,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
    break;
  case -0xb:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0xb,(char *)0xa2c,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible."
                   );
    break;
  case -10:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-10,(char *)0xa30,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg repeated recoverable right-hand side function errors.");
    break;
  case -8:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-8,(char *)0xa28,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
    break;
  case -7:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-7,(char *)0xa24,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, the solve routine failed in an unrecoverable manner.");
    break;
  case -6:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-6,(char *)0xa20,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg, the setup routine failed in an unrecoverable manner.");
    break;
  case -4:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI->h,(int)in_RDI,(char *)0xfffffffc,
                    (char *)0xa1c,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %lg and h = %lg, the solver convergence test failed repeatedly or with |h| = hmin."
                   );
    break;
  case -3:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI->h,(int)in_RDI,(char *)0xfffffffd,
                    (char *)0xa18,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.")
    ;
  }
  return local_4;
}

Assistant:

int arkHandleFailure(ARKodeMem ark_mem, int flag)
{
  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case ARK_ERR_FAILURE:
    arkProcessError(ark_mem, ARK_ERR_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_ERR_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_CONV_FAILURE:
    arkProcessError(ark_mem, ARK_CONV_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_CONV_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_LSETUP_FAIL:
    arkProcessError(ark_mem, ARK_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SETUP_FAILED, ark_mem->tcur);
    break;
  case ARK_LSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SOLVE_FAILED, ark_mem->tcur);
    break;
  case ARK_RHSFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RHSFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_UNREC_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_UNREC_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_UNREC, ark_mem->tcur);
    break;
  case ARK_REPTD_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_REPTD_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_REPTD, ark_mem->tcur);
    break;
  case ARK_RTFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RTFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_TOO_CLOSE:
    arkProcessError(ark_mem, ARK_TOO_CLOSE, __LINE__, __func__, __FILE__,
                    MSG_ARK_TOO_CLOSE);
    break;
  case ARK_CONSTR_FAIL:
    arkProcessError(ark_mem, ARK_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_FAILED_CONSTR, ark_mem->tcur);
    break;
  case ARK_MASSSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MASSSOLVE_FAIL);
    break;
  case ARK_NLS_SETUP_FAIL:
    arkProcessError(ark_mem, ARK_NLS_SETUP_FAIL, __LINE__, __func__,
                    __FILE__, "At t = %Lg the nonlinear solver setup failed unrecoverably",
                    (long double)ark_mem->tcur);
    break;
  case ARK_VECTOROP_ERR:
    arkProcessError(ark_mem, ARK_VECTOROP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_VECTOROP_ERR, ark_mem->tcur);
    break;
  case ARK_INNERSTEP_FAIL:
    arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_INNERSTEP_FAILED, ark_mem->tcur);
    break;
  case ARK_NLS_OP_ERR:
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_NLS_FAIL, ark_mem->tcur);
    break;
  case ARK_USER_PREDICT_FAIL:
    arkProcessError(ark_mem, ARK_USER_PREDICT_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_USER_PREDICT_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STEP_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STEP_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STEP_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STAGE_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STAGE_FAIL, ark_mem->tcur);
    break;
  case ARK_INTERP_FAIL:
    arkProcessError(ark_mem, ARK_INTERP_FAIL, __LINE__, __func__, __FILE__,
                    "At t = %Lg the interpolation module failed unrecoverably",
                    (long double)ark_mem->tcur);
    break;
  case ARK_INVALID_TABLE:
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "ARKODE was provided an invalid method table");
    break;
  case ARK_RELAX_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FAIL, __LINE__, __func__, __FILE__,
                    "At t = %Lg the relaxation module failed",
                    (long double)ark_mem->tcur);
    break;
  case ARK_RELAX_MEM_NULL:
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    "The ARKODE relaxation module memory is NULL");
    break;
  case ARK_RELAX_FUNC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FUNC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation function failed unrecoverably");
    break;
  case ARK_RELAX_JAC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_JAC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation Jacobian failed unrecoverably");
    break;
  default:
    /* This return should never happen */
    arkProcessError(ark_mem, ARK_UNRECOGNIZED_ERROR, __LINE__, __func__, __FILE__,
                    "ARKODE encountered an unrecognized error. Please report "
                    "this to the Sundials developers at "
                    "sundials-users@llnl.gov");
    return (ARK_UNRECOGNIZED_ERROR);
  }

  return (flag);
}